

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FileDescriptor * __thiscall
google::protobuf::DescriptorBuilder::BuildFile(DescriptorBuilder *this,FileDescriptorProto *proto)

{
  DescriptorPool *pDVar1;
  Tables *pTVar2;
  bool bVar3;
  __type _Var4;
  Edition edition;
  int iVar5;
  DescriptorPool *pDVar6;
  string *psVar7;
  FileDescriptor *pFVar8;
  size_type sVar9;
  reference __lhs;
  ulong uVar10;
  type pFVar11;
  FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
  *this_00;
  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  *this_01;
  string_view sVar12;
  FileDescriptor *result;
  unique_ptr<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
  local_90;
  __single_object alloc;
  int local_54;
  int i_1;
  ulong local_40;
  size_t i;
  FileDescriptor *existing_file;
  FileDescriptorProto *proto_local;
  DescriptorBuilder *this_local;
  
  pDVar1 = this->pool_;
  pDVar6 = DescriptorPool::internal_generated_pool();
  if (pDVar1 != pDVar6) {
    DescriptorPool::generated_pool();
  }
  psVar7 = FileDescriptorProto::name_abi_cxx11_(proto);
  std::__cxx11::string::operator=((string *)&this->filename_,(string *)psVar7);
  pTVar2 = this->tables_;
  sVar12 = (string_view)
           std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->filename_);
  pFVar8 = DescriptorPool::Tables::FindFile(pTVar2,sVar12);
  if (pFVar8 != (FileDescriptor *)0x0) {
    edition = FileDescriptor::edition(pFVar8);
    bVar3 = ExistingFileMatchesProto(edition,pFVar8,proto);
    if (bVar3) {
      return pFVar8;
    }
  }
  for (local_40 = 0;
      sVar9 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->tables_->pending_files_), local_40 < sVar9; local_40 = local_40 + 1) {
    __lhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&this->tables_->pending_files_,local_40);
    psVar7 = FileDescriptorProto::name_abi_cxx11_(proto);
    _Var4 = std::operator==(__lhs,psVar7);
    if (_Var4) {
      AddRecursiveImportError(this,proto,(int)local_40);
      return (FileDescriptor *)0x0;
    }
  }
  FileDescriptorProto::package_abi_cxx11_(proto);
  uVar10 = std::__cxx11::string::size();
  if (uVar10 < 0x200) {
    if (((this->pool_->lazily_build_dependencies_ & 1U) == 0) &&
       (this->pool_->fallback_database_ != (DescriptorDatabase *)0x0)) {
      pTVar2 = this->tables_;
      psVar7 = FileDescriptorProto::name_abi_cxx11_(proto);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&pTVar2->pending_files_,psVar7);
      for (local_54 = 0; iVar5 = FileDescriptorProto::dependency_size(proto), local_54 < iVar5;
          local_54 = local_54 + 1) {
        pTVar2 = this->tables_;
        psVar7 = FileDescriptorProto::dependency_abi_cxx11_(proto,local_54);
        sVar12 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar7);
        pFVar8 = DescriptorPool::Tables::FindFile(pTVar2,sVar12);
        if (pFVar8 == (FileDescriptor *)0x0) {
          if (this->pool_->underlay_ != (DescriptorPool *)0x0) {
            pDVar1 = this->pool_->underlay_;
            psVar7 = FileDescriptorProto::dependency_abi_cxx11_(proto,local_54);
            sVar12 = (string_view)
                     std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar7);
            pFVar8 = DescriptorPool::FindFileByName(pDVar1,sVar12);
            if (pFVar8 != (FileDescriptor *)0x0) goto LAB_002eb527;
          }
          pDVar1 = this->pool_;
          psVar7 = FileDescriptorProto::dependency_abi_cxx11_(proto,local_54);
          sVar12 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar7);
          alloc._M_t.
          super___uniq_ptr_impl<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
          ._M_t.
          super__Tuple_impl<0UL,_google::protobuf::internal::FlatAllocator_*,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
          .super__Head_base<0UL,_google::protobuf::internal::FlatAllocator_*,_false>._M_head_impl =
               (__uniq_ptr_data<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>,_true,_true>
                )sVar12._M_len;
          DescriptorPool::TryFindFileInFallbackDatabase(pDVar1,sVar12,this->deferred_validation_);
        }
LAB_002eb527:
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back(&this->tables_->pending_files_);
    }
    DescriptorPool::Tables::AddCheckpoint(this->tables_);
    std::make_unique<google::protobuf::internal::FlatAllocator>();
    pFVar11 = std::
              unique_ptr<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
              ::operator*(&local_90);
    PlanAllocationSize(proto,pFVar11);
    this_00 = (FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
               *)std::
                 unique_ptr<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                 ::operator->(&local_90);
    protobuf::(anonymous_namespace)::
    FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
    ::FinalizePlanning<google::protobuf::DescriptorPool::Tables*>(this_00,&this->tables_);
    pFVar11 = std::
              unique_ptr<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
              ::operator*(&local_90);
    this_local = (DescriptorBuilder *)BuildFileImpl(this,proto,pFVar11);
    FileDescriptorTables::FinalizeTables(this->file_tables_);
    if (this_local == (DescriptorBuilder *)0x0) {
      DescriptorPool::Tables::RollbackToLastCheckpoint(this->tables_,this->deferred_validation_);
    }
    else {
      DescriptorPool::Tables::ClearLastCheckpoint(this->tables_);
      ((SymbolBase *)&this_local->pool_)[2] = '\x01';
      this_01 = &std::
                 unique_ptr<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
                 ::operator->(&local_90)->
                 super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
      ;
      anon_unknown_24::
      FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
      ::ExpectConsumed(this_01);
    }
    std::
    unique_ptr<google::protobuf::internal::FlatAllocator,_std::default_delete<google::protobuf::internal::FlatAllocator>_>
    ::~unique_ptr(&local_90);
  }
  else {
    psVar7 = FileDescriptorProto::package_abi_cxx11_(proto);
    sVar12 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar7)
    ;
    AddError(this,sVar12,&proto->super_Message,NAME,"Package name is too long");
    this_local = (DescriptorBuilder *)0x0;
  }
  return (FileDescriptor *)this_local;
}

Assistant:

const FileDescriptor* DescriptorBuilder::BuildFile(
    const FileDescriptorProto& proto) {
  // Ensure the generated pool has been lazily initialized.  This is most
  // important for protos that use C++-specific features, since that extension
  // is only registered lazily and we always parse options into the generated
  // pool.
  if (pool_ != DescriptorPool::internal_generated_pool()) {
    DescriptorPool::generated_pool();
  }

  filename_ = proto.name();

  // Check if the file already exists and is identical to the one being built.
  // Note:  This only works if the input is canonical -- that is, it
  //   fully-qualifies all type names, has no UninterpretedOptions, etc.
  //   This is fine, because this idempotency "feature" really only exists to
  //   accommodate one hack in the proto1->proto2 migration layer.
  const FileDescriptor* existing_file = tables_->FindFile(filename_);
  if (existing_file != nullptr) {
    // File already in pool.  Compare the existing one to the input.
    if (ExistingFileMatchesProto(existing_file->edition(), existing_file,
                                 proto)) {
      // They're identical.  Return the existing descriptor.
      return existing_file;
    }

    // Not a match.  The error will be detected and handled later.
  }

  // Check to see if this file is already on the pending files list.
  // TODO:  Allow recursive imports?  It may not work with some
  //   (most?) programming languages.  E.g., in C++, a forward declaration
  //   of a type is not sufficient to allow it to be used even in a
  //   generated header file due to inlining.  This could perhaps be
  //   worked around using tricks involving inserting #include statements
  //   mid-file, but that's pretty ugly, and I'm pretty sure there are
  //   some languages out there that do not allow recursive dependencies
  //   at all.
  for (size_t i = 0; i < tables_->pending_files_.size(); i++) {
    if (tables_->pending_files_[i] == proto.name()) {
      AddRecursiveImportError(proto, i);
      return nullptr;
    }
  }

  static const int kMaximumPackageLength = 511;
  if (proto.package().size() > kMaximumPackageLength) {
    AddError(proto.package(), proto, DescriptorPool::ErrorCollector::NAME,
             "Package name is too long");
    return nullptr;
  }

  // If we have a fallback_database_, and we aren't doing lazy import building,
  // attempt to load all dependencies now, before checkpointing tables_.  This
  // avoids confusion with recursive checkpoints.
  if (!pool_->lazily_build_dependencies_) {
    if (pool_->fallback_database_ != nullptr) {
      tables_->pending_files_.push_back(proto.name());
      for (int i = 0; i < proto.dependency_size(); i++) {
        if (tables_->FindFile(proto.dependency(i)) == nullptr &&
            (pool_->underlay_ == nullptr ||
             pool_->underlay_->FindFileByName(proto.dependency(i)) ==
                 nullptr)) {
          // We don't care what this returns since we'll find out below anyway.
          pool_->TryFindFileInFallbackDatabase(proto.dependency(i),
                                               deferred_validation_);
        }
      }
      tables_->pending_files_.pop_back();
    }
  }

  // Checkpoint the tables so that we can roll back if something goes wrong.
  tables_->AddCheckpoint();

  auto alloc = absl::make_unique<internal::FlatAllocator>();
  PlanAllocationSize(proto, *alloc);
  alloc->FinalizePlanning(tables_);
  FileDescriptor* result = BuildFileImpl(proto, *alloc);

  file_tables_->FinalizeTables();
  if (result) {
    tables_->ClearLastCheckpoint();
    result->finished_building_ = true;
    alloc->ExpectConsumed();
  } else {
    tables_->RollbackToLastCheckpoint(deferred_validation_);
  }

  return result;
}